

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall
wallet::wallet_tests::coin_mark_dirty_immature_credit::test_method
          (coin_mark_dirty_immature_credit *this)

{
  uint256 block_hash;
  undefined1 uVar1;
  CAmount CVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  CWalletTx wtx;
  CWallet wallet;
  ChainstateManager *in_stack_fffffffffffff648;
  char *this_00;
  TxStateConfirmed *in_stack_fffffffffffff650;
  lazy_ostream *prev;
  CBlockIndex *in_stack_fffffffffffff658;
  char *this_01;
  CWallet *wallet_00;
  undefined4 in_stack_fffffffffffff668;
  int in_stack_fffffffffffff66c;
  undefined7 in_stack_fffffffffffff670;
  undefined1 in_stack_fffffffffffff677;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  lazy_ostream *in_stack_fffffffffffff680;
  CKey *in_stack_fffffffffffff688;
  unit_test_log_t *this_02;
  undefined7 in_stack_fffffffffffff690;
  undefined1 in_stack_fffffffffffff697;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff698;
  CTransactionRef *in_stack_fffffffffffff6a0;
  CWalletTx *in_stack_fffffffffffff6a8;
  _func_int **local_8b0;
  undefined4 in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff75c;
  string *in_stack_fffffffffffff760;
  Chain *in_stack_fffffffffffff768;
  CWallet *in_stack_fffffffffffff770;
  undefined1 local_888 [64];
  lazy_ostream local_848;
  undefined1 local_838 [16];
  CWallet *in_stack_fffffffffffff7d8;
  allocator<char> local_7c9 [33];
  CWalletTx *local_7a8;
  lazy_ostream *plStack_7a0;
  CWallet *local_798;
  CWallet *pCStack_790;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_fffffffffffff648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff698,
             (char *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             (allocator<char> *)in_stack_fffffffffffff688);
  local_4e8 = 0;
  uStack_4e0 = 0;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_508 = 0;
  uStack_500 = 0;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_fffffffffffff648);
  CreateMockableWalletDatabase((MockableData *)in_stack_fffffffffffff658);
  CWallet::CWallet(in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffff658);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_fffffffffffff648);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff648);
  std::allocator<char>::~allocator(local_7c9);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff648);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff688,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff680,
             (char *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (char *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670),
             in_stack_fffffffffffff66c,SUB41((uint)in_stack_fffffffffffff668 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff688,(char *)in_stack_fffffffffffff680,in_stack_fffffffffffff67c,
             (char *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670),
             (char *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  uVar1 = (undefined1)((uint)in_stack_fffffffffffff668 >> 0x18);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff648);
  ChainstateManager::GetMutex(in_stack_fffffffffffff648);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff648);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff688,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff680,
             (char *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
             (char *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670),
             in_stack_fffffffffffff66c,(bool)uVar1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_fffffffffffff648);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff648,
             (shared_ptr<const_CTransaction> *)0xe2cc4f);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff648);
  ChainstateManager::ActiveChain(in_stack_fffffffffffff648);
  CChain::Tip((CChain *)in_stack_fffffffffffff658);
  CBlockIndex::GetBlockHash(in_stack_fffffffffffff658);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff648);
  ChainstateManager::ActiveChain(in_stack_fffffffffffff648);
  CChain::Height((CChain *)in_stack_fffffffffffff648);
  TxStateConfirmed::TxStateConfirmed
            ((TxStateConfirmed *)in_stack_fffffffffffff658,
             &in_stack_fffffffffffff650->confirmed_block_hash,
             (int)((ulong)in_stack_fffffffffffff648 >> 0x20),(int)in_stack_fffffffffffff648);
  std::
  variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
  ::variant<wallet::TxStateConfirmed,void,void,wallet::TxStateConfirmed,void>
            ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)in_stack_fffffffffffff658,in_stack_fffffffffffff650);
  CWalletTx::CWalletTx
            (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             (TxState *)in_stack_fffffffffffff698);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff648);
  CWallet::SetWalletFlag
            ((CWallet *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             (uint64_t)in_stack_fffffffffffff688);
  CWallet::SetupDescriptorScriptPubKeyMans(in_stack_fffffffffffff7d8);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff648);
  ChainstateManager::ActiveChain(in_stack_fffffffffffff648);
  CChain::Height((CChain *)in_stack_fffffffffffff648);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff648);
  ChainstateManager::ActiveChain(in_stack_fffffffffffff648);
  CChain::Tip((CChain *)in_stack_fffffffffffff658);
  CBlockIndex::GetBlockHash(in_stack_fffffffffffff658);
  block_hash.super_base_blob<256U>.m_data._M_elems[7] = in_stack_fffffffffffff677;
  block_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffff670;
  block_hash.super_base_blob<256U>.m_data._M_elems[1] =
       (char)((uint7)in_stack_fffffffffffff670 >> 8);
  block_hash.super_base_blob<256U>.m_data._M_elems[2] =
       (char)((uint7)in_stack_fffffffffffff670 >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[3] =
       (char)((uint7)in_stack_fffffffffffff670 >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems[4] =
       (char)((uint7)in_stack_fffffffffffff670 >> 0x20);
  block_hash.super_base_blob<256U>.m_data._M_elems[5] =
       (char)((uint7)in_stack_fffffffffffff670 >> 0x28);
  block_hash.super_base_blob<256U>.m_data._M_elems[6] =
       (char)((uint7)in_stack_fffffffffffff670 >> 0x30);
  block_hash.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_fffffffffffff678;
  block_hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)in_stack_fffffffffffff678 >> 8)
  ;
  block_hash.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((uint)in_stack_fffffffffffff678 >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((uint)in_stack_fffffffffffff678 >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_fffffffffffff67c;
  block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((uint)in_stack_fffffffffffff67c >> 8);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((uint)in_stack_fffffffffffff67c >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((uint)in_stack_fffffffffffff67c >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_fffffffffffff680;
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffff688;
  CWallet::SetLastBlockProcessed(local_798,(int)((ulong)plStack_7a0 >> 0x20),block_hash);
  this_00 = (char *)local_7a8;
  prev = plStack_7a0;
  this_01 = (char *)local_798;
  wallet_00 = pCStack_790;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff688,
               (const_string *)in_stack_fffffffffffff680,
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (const_string *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    local_848._vptr_lazy_ostream._4_4_ = 2;
    local_848._8_8_ = CachedTxGetImmatureCredit(wallet_00,(CWalletTx *)this_01,(isminefilter *)prev)
    ;
    local_848._vptr_lazy_ostream._0_4_ = 0;
    this_01 = "0";
    prev = &local_848;
    this_00 = "CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (&stack0xfffffffffffff7d8,local_838,0x182,1,2,&local_848.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    uVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar1);
  CWalletTx::MarkDirty((CWalletTx *)this_00);
  AddKey((CWallet *)CONCAT17(uVar1,in_stack_fffffffffffff690),in_stack_fffffffffffff688);
  do {
    this_02 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,(const_string *)in_stack_fffffffffffff680,
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
               (const_string *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670));
    in_stack_fffffffffffff680 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    CVar2 = CachedTxGetImmatureCredit(wallet_00,(CWalletTx *)this_01,(isminefilter *)prev);
    in_stack_fffffffffffff678 = (undefined4)CVar2;
    in_stack_fffffffffffff67c = (int)((ulong)CVar2 >> 0x20);
    local_8b0 = (_func_int **)0x12a05f200;
    this_01 = "50*COIN";
    prev = (lazy_ostream *)&local_8b0;
    this_00 = "CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_888,&stack0xfffffffffffff768,0x188,1,2,&stack0xfffffffffffff760);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    in_stack_fffffffffffff677 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff677);
  CWalletTx::~CWalletTx((CWalletTx *)this_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00);
  CWallet::~CWallet((CWallet *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coin_mark_dirty_immature_credit, TestChain100Setup)
{
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());

    LOCK(wallet.cs_wallet);
    LOCK(Assert(m_node.chainman)->GetMutex());
    CWalletTx wtx{m_coinbase_txns.back(), TxStateConfirmed{m_node.chainman->ActiveChain().Tip()->GetBlockHash(), m_node.chainman->ActiveChain().Height(), /*index=*/0}};
    wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    wallet.SetupDescriptorScriptPubKeyMans();

    wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());

    // Call GetImmatureCredit() once before adding the key to the wallet to
    // cache the current immature credit amount, which is 0.
    BOOST_CHECK_EQUAL(CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE), 0);

    // Invalidate the cached value, add the key, and make sure a new immature
    // credit amount is calculated.
    wtx.MarkDirty();
    AddKey(wallet, coinbaseKey);
    BOOST_CHECK_EQUAL(CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE), 50*COIN);
}